

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo
          (ShaderPerformanceMeasurer *this,TestLog *log)

{
  int iVar1;
  int iVar2;
  deUint64 dVar3;
  string *psVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  allocator<char> local_38c;
  allocator<char> local_38b;
  allocator<char> local_38a;
  allocator<char> local_389;
  allocator<char> local_388;
  allocator<char> local_387;
  allocator<char> local_386;
  allocator<char> local_385;
  allocator<char> local_384;
  allocator<char> local_383;
  allocator<char> local_382;
  allocator<char> local_381;
  int local_380;
  int local_37c;
  long local_378;
  TestLog *local_370;
  double local_368;
  double dStack_360;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  LogNumber<float> local_1d0;
  LogNumber<float> local_168;
  LogNumber<float> local_100;
  LogNumber<float> local_98;
  
  dVar3 = MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
  iVar5 = (int)((ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_calibrator).m_measureState.frameTimes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_380 = (this->m_calibrator).m_measureState.numDrawCalls * iVar5;
  local_378 = (long)this->m_viewportWidth;
  iVar1 = this->m_viewportHeight;
  local_37c = this->m_gridSizeX;
  iVar2 = this->m_gridSizeY;
  local_370 = log;
  logCalibrationInfo(log,&this->m_calibrator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"FramesPerSecond",&local_381);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Frames per second in measurement",&local_382);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Frames/s",&local_383);
  auVar8._8_4_ = (int)(dVar3 >> 0x20);
  auVar8._0_8_ = dVar3;
  auVar8._12_4_ = 0x45300000;
  dStack_360 = auVar8._8_8_ - 1.9342813113834067e+25;
  local_368 = dStack_360 + ((double)CONCAT44(0x43300000,(int)dVar3) - 4503599627370496.0);
  psVar4 = &local_230;
  tcu::LogNumber<float>::LogNumber
            (&local_98,&local_1f0,&local_210,psVar4,QP_KEY_TAG_PERFORMANCE,
             (float)((double)iVar5 / (local_368 / 1000000.0)));
  iVar5 = (int)local_370;
  tcu::LogNumber<float>::write(&local_98,iVar5,__buf,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"FragmentsPerVertices",&local_384);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Vertex-fragment ratio",&local_385);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Fragments/Vertices",&local_386);
  lVar6 = iVar1 * local_378 * (long)local_380;
  lVar7 = (long)((iVar2 + 1) * (local_37c + 1)) * (long)local_380;
  psVar4 = &local_290;
  tcu::LogNumber<float>::LogNumber
            (&local_100,&local_250,&local_270,psVar4,QP_KEY_TAG_NONE,(float)lVar6 / (float)lVar7);
  tcu::LogNumber<float>::write(&local_100,iVar5,__buf_00,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"FragmentPerf",&local_387)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Fragment performance",&local_388);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"MPix/s",&local_389);
  psVar4 = &local_2f0;
  tcu::LogNumber<float>::LogNumber
            (&local_168,&local_2b0,&local_2d0,psVar4,QP_KEY_TAG_PERFORMANCE,
             (float)((double)lVar6 / local_368));
  tcu::LogNumber<float>::write(&local_168,iVar5,__buf_01,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"VertexPerf",&local_38a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"Vertex performance",&local_38b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"MVert/s",&local_38c);
  psVar4 = &local_350;
  tcu::LogNumber<float>::LogNumber
            (&local_1d0,&local_310,&local_330,psVar4,QP_KEY_TAG_PERFORMANCE,
             (float)((double)lVar7 / local_368));
  tcu::LogNumber<float>::write(&local_1d0,iVar5,__buf_02,(size_t)psVar4);
  tcu::LogNumber<float>::~LogNumber(&local_1d0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  tcu::LogNumber<float>::~LogNumber(&local_168);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  tcu::LogNumber<float>::~LogNumber(&local_100);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::LogNumber<float>::~LogNumber(&local_98);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

void ShaderPerformanceMeasurer::logMeasurementInfo (TestLog& log) const
{
	DE_ASSERT(m_state == STATE_FINISHED);

	const MeasureState& measureState(m_calibrator.getMeasureState());

	// Compute totals.
	deUint64	totalTime			= measureState.getTotalTime();
	int			numFrames			= (int)measureState.frameTimes.size();
	deInt64		numQuadGrids		= measureState.numDrawCalls * numFrames;
	deInt64		numPixels			= (deInt64)m_viewportWidth * (deInt64)m_viewportHeight * numQuadGrids;
	deInt64		numVertices			= (deInt64)getNumVertices(m_gridSizeX, m_gridSizeY) * numQuadGrids;
	double		mfragPerSecond		= (double)numPixels / (double)totalTime;
	double		mvertPerSecond		= (double)numVertices / (double)totalTime;
	double		framesPerSecond		= (double)numFrames / ((double)totalTime / 1000000.0);

	logCalibrationInfo(log, m_calibrator);

	log << TestLog::Float("FramesPerSecond",		"Frames per second in measurement",	"Frames/s",				QP_KEY_TAG_PERFORMANCE,	(float)framesPerSecond)
		<< TestLog::Float("FragmentsPerVertices",	"Vertex-fragment ratio",			"Fragments/Vertices",	QP_KEY_TAG_NONE,		(float)numPixels / (float)numVertices)
		<< TestLog::Float("FragmentPerf",			"Fragment performance",				"MPix/s",				QP_KEY_TAG_PERFORMANCE, (float)mfragPerSecond)
		<< TestLog::Float("VertexPerf",				"Vertex performance",				"MVert/s",				QP_KEY_TAG_PERFORMANCE, (float)mvertPerSecond);
}